

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O0

bool __thiscall Network::Client::RingBufferStorage::Impl::release(Impl *this,uint16 packetID)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  PacketBookmark *pPVar4;
  int iVar5;
  uint local_60;
  uint32 local_5c;
  PacketBookmark *iter;
  uint8 j;
  bool continueSearching;
  uint32 u;
  uint32 E;
  uint32 W;
  uint32 s;
  uint32 end;
  uint32 size;
  uint32 pos;
  PacketBookmark *packet;
  uint8 i;
  uint16 packetID_local;
  Impl *this_local;
  
  bVar3 = findID(this,(uint)packetID);
  if (bVar3 == this->packetsCount) {
    this_local._7_1_ = false;
  }
  else {
    pPVar4 = this->packets + (ulong)bVar3 * 0xc;
    end = *(uint32 *)(pPVar4 + 8);
    iVar1 = *(int *)(pPVar4 + 4);
    W = *(int *)(pPVar4 + 8) + *(int *)(pPVar4 + 4) & this->sm1;
    PacketBookmark::set(pPVar4,0,0,0);
    if (end == this->r) {
      this->r = this->r + iVar1 & this->sm1;
      this_local._7_1_ = true;
    }
    else if (W == this->w) {
      this->w = end;
      this_local._7_1_ = true;
    }
    else {
      iVar5 = this->sm1 + 1;
      if (this->w < end) {
        local_5c = this->w + iVar5;
      }
      else {
        local_5c = this->w;
      }
      local_60 = W;
      if (W < end) {
        local_60 = W + iVar5;
      }
      for (iter._4_4_ = 0; iter._4_4_ < local_5c - local_60; iter._4_4_ = iter._4_4_ + 1) {
        this->buffer[iter._4_4_ + end & this->sm1] =
             this->buffer[iter._4_4_ + end + iVar1 & this->sm1];
      }
      this->w = local_5c - iVar1 & this->sm1;
      bVar2 = true;
LAB_00131510:
      if (bVar2) {
        bVar2 = false;
        for (iter._2_1_ = 0; iter._2_1_ < this->packetsCount; iter._2_1_ = iter._2_1_ + 1) {
          pPVar4 = this->packets;
          if (*(uint32 *)(pPVar4 + (ulong)iter._2_1_ * 0xc + 8) == W) {
            W = *(int *)(pPVar4 + (ulong)iter._2_1_ * 0xc + 8) +
                *(int *)(pPVar4 + (ulong)iter._2_1_ * 0xc + 4) & this->sm1;
            *(uint32 *)(pPVar4 + (ulong)iter._2_1_ * 0xc + 8) = end;
            end = *(int *)(pPVar4 + (ulong)iter._2_1_ * 0xc + 8) +
                  *(int *)(pPVar4 + (ulong)iter._2_1_ * 0xc + 4) & this->sm1;
            bVar2 = true;
            break;
          }
        }
        goto LAB_00131510;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool release(const uint16 packetID)
        {
            uint8 i = findID(packetID);
            if (i == packetsCount) return false;

            PacketBookmark & packet = packets[i];

            // Here, we have 2 cases. Either the packet is on the read position of the ring buffer
            // and in that case, we just need to advance the read position.
            // Either it's in the middle of the ring buffer and we need to move all the data around to remove it
            // Let's deal with the former case first
            uint32 pos = packet.pos, size = packet.size, end = (packet.pos + packet.size) & sm1;
            packet.set(0, 0, 0);
            if (pos == r)
            {
                r = (r + size) & sm1;
                return true;
            }

            // Another optimization step is when the write position is at the end of this packet
            // We can just revert the storage of the packet directly
            if (end == w)
            {
                w = pos;
                return true;
            }

            // Ok, now we have to move the data around here
            // First let's move memory to remove that packet.
            // We'll fix the packet's position later on
            // We are in this case here:
            //  bbbbccw  r p   eaaaaaaaaa      with p/e (pos/end) and a / b / c the next packet
            //        |  | |   |
            // [-------------------------]
            // After move, it should look like:
            //  ccw       r aaaaaaaaabbbb      with p/e (pos/end) and a / b / c the next packet
            //    |       | |   |
            // [-------------------------]
            // We see they are 3 sections: a is the data between e and the buffer end
            // b is the data whose size is equal to buffer end - p - sizeof(a) (the part that was moved from
            // the beginning of the buffer to the end of the buffer)
            // and c is the part that was move from the end of the packet to the beginning of the buffer
            // We have to perform move a to p, move b to buffer.end - a.size and move c to buffer begin

            // It's hard to think without unwrapping the buffer, so let's imagine we are doing so (we'll rewrap after discussion)
            // Let's set w' = w+sm1+1, e' = e + (sm1 - 1)
            // It'll lead to this diagram:
            //  bbbbccw  r p   eaaaaaaaaa BBBBCCW       with p/e (pos/end) and a / b / c the next packet
            //        |  | |   |                |
            // [-------------------------:-------------------------]
            // Or
            //     eaacccccw  r        p     EAACCCCCW
            //     |       |  |        |     |       |
            // [-------------------------:-------------------------]
            // Or
            //      r  p    eaaaaa w
            //      |  |    |    | |
            // [-------------------------:-------------------------]
            // In that case, we are doing a single memory move operation here, but we simply wrap the position
            uint32 s = sm1 + 1, W = w < pos ? w + s : w, E = end < pos ? end + s : end;

            for (uint32 u = 0; u < W - E; u++)
                buffer[(u + pos) & sm1] = buffer[(u + pos + size) & sm1];

            // Adjust the new write position
            w = (W - size) & sm1;

            // We can split the packets in 2 cases: before or after the packet to remove.
            // We'll iterate each packet and decide if we need to move it (it's after the packet to remove)
            // This isn't the most efficient algorithm, but since the number of packets to store is small
            // there's no point in optimizing it further

            bool continueSearching = true;
            while (continueSearching)
            {
                continueSearching = false;
                for (uint8 j = 0; j < packetsCount; j++)
                {
                    PacketBookmark & iter = packets[j];
                    if (iter.pos == end)
                    {
                        end = (iter.pos + iter.size) & sm1;
                        iter.pos = pos;
                        pos = (iter.pos + iter.size) & sm1;
                        continueSearching = true;
                        break;
                    }
                }
            }
            return true;
        }